

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O3

void __thiscall
fasttext::ProductQuantizer::addcode
          (ProductQuantizer *this,Vector *x,uint8_t *codes,int32_t t,real alpha)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  pointer pfVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  float *pfVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  undefined1 in_register_00001204 [12];
  
  iVar1 = this->nsubq_;
  if (0 < (long)iVar1) {
    uVar2 = this->dsub_;
    iVar3 = this->ksub_;
    iVar4 = this->lastdsub_;
    pfVar5 = (this->centroids_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar8 = (x->data_).mem_;
    uVar10 = 0;
    uVar7 = uVar2;
    do {
      iVar11 = (int)uVar10 * iVar3;
      if (uVar10 == iVar1 - 1) {
        iVar11 = iVar11 * uVar2 + (uint)codes[uVar10 + (long)(t * iVar1)] * iVar4;
        uVar7 = this->lastdsub_;
      }
      else {
        iVar11 = (iVar11 + (uint)codes[uVar10 + (long)(t * iVar1)]) * uVar2;
      }
      if (0 < (int)uVar7) {
        uVar9 = 0;
        do {
          auVar6._4_12_ = in_register_00001204;
          auVar6._0_4_ = alpha;
          auVar6 = vfmadd213ss_fma(ZEXT416((uint)pfVar5[(long)iVar11 + uVar9]),auVar6,
                                   ZEXT416((uint)pfVar8[uVar9]));
          pfVar8[uVar9] = auVar6._0_4_;
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      uVar10 = uVar10 + 1;
      pfVar8 = pfVar8 + (int)uVar2;
    } while (uVar10 != (long)iVar1);
  }
  return;
}

Assistant:

void ProductQuantizer::addcode(
    Vector& x,
    const uint8_t* codes,
    int32_t t,
    real alpha) const {
  auto d = dsub_;
  const uint8_t* code = codes + nsubq_ * t;
  for (auto m = 0; m < nsubq_; m++) {
    const real* c = get_centroids(m, code[m]);
    if (m == nsubq_ - 1) {
      d = lastdsub_;
    }
    for (auto n = 0; n < d; n++) {
      x[m * dsub_ + n] += alpha * c[n];
    }
  }
}